

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

MDD lddmc_union_cube_copy(MDD a,uint32_t *values,int *copy,size_t count)

{
  uint uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  MDD MVar4;
  MDD MVar5;
  uint value;
  long lVar6;
  
  if (a == 1) {
    if (count == 0) {
      return 1;
    }
    __assert_fail("count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                  ,0x711,"MDD lddmc_union_cube_copy(MDD, uint32_t *, int *, size_t)");
  }
  if (a != 0) {
    if (count == 0) {
      __assert_fail("count != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x714,"MDD lddmc_union_cube_copy(MDD, uint32_t *, int *, size_t)");
    }
    lVar6 = a * 0x10;
    puVar2 = nodes->data;
    uVar3 = *(ulong *)(puVar2 + lVar6 + 8);
    if (((uint)uVar3 >> 0x10 & 1) == 0) {
      if (*copy == 0) {
        uVar1 = *(uint *)(puVar2 + lVar6 + 6);
        value = *values;
        if (uVar1 < value) {
          MVar5 = lddmc_union_cube_copy
                            (*(ulong *)(puVar2 + lVar6) >> 1 & 0x7fffffffffff,values,copy,count);
          if (MVar5 == (*(ulong *)(puVar2 + lVar6) >> 1 & 0x7fffffffffff)) {
            return a;
          }
          MVar4 = *(ulong *)(puVar2 + lVar6 + 8) >> 0x11;
          a = MVar5;
          value = uVar1;
        }
        else if (uVar1 == value) {
          MVar4 = lddmc_union_cube_copy(uVar3 >> 0x11,values + 1,copy + 1,count - 1);
          if (MVar4 == *(ulong *)(puVar2 + lVar6 + 8) >> 0x11) {
            return a;
          }
          a = *(ulong *)(puVar2 + lVar6) >> 1 & 0x7fffffffffff;
          value = uVar1;
        }
        else {
          MVar4 = lddmc_cube_copy(values + 1,copy + 1,count - 1);
        }
        MVar4 = lddmc_makenode(value,MVar4,a);
        return MVar4;
      }
      MVar5 = lddmc_cube_copy(values + 1,copy + 1,count - 1);
      MVar4 = a;
    }
    else if (*copy == 0) {
      MVar4 = lddmc_union_cube_copy
                        (*(ulong *)(puVar2 + lVar6) >> 1 & 0x7fffffffffff,values,copy,count);
      if (MVar4 == (*(ulong *)(puVar2 + lVar6) >> 1 & 0x7fffffffffff)) {
        return a;
      }
      MVar5 = *(ulong *)(puVar2 + lVar6 + 8) >> 0x11;
    }
    else {
      MVar5 = lddmc_union_cube_copy(uVar3 >> 0x11,values + 1,copy + 1,count - 1);
      if (MVar5 == *(ulong *)(puVar2 + lVar6 + 8) >> 0x11) {
        return a;
      }
      MVar4 = *(ulong *)(puVar2 + lVar6) >> 1 & 0x7fffffffffff;
    }
    MVar4 = lddmc_make_copynode(MVar5,MVar4);
    return MVar4;
  }
  MVar4 = lddmc_cube_copy(values,copy,count);
  return MVar4;
}

Assistant:

MDD
lddmc_union_cube_copy(MDD a, uint32_t* values, int* copy, size_t count)
{
    if (a == lddmc_false) return lddmc_cube_copy(values, copy, count);
    if (a == lddmc_true) {
        assert(count == 0);
        return lddmc_true;
    }
    assert(count != 0);

    mddnode_t na = LDD_GETNODE(a);

    /* Only create a new node if something actually changed */

    int na_copy = mddnode_getcopy(na);
    if (na_copy && *copy) {
        MDD down = lddmc_union_cube_copy(mddnode_getdown(na), values+1, copy+1, count-1);
        if (down == mddnode_getdown(na)) return a; // no actual change
        return lddmc_make_copynode(down, mddnode_getright(na));
    } else if (na_copy) {
        MDD right = lddmc_union_cube_copy(mddnode_getright(na), values, copy, count);
        if (right == mddnode_getright(na)) return a; // no actual change
        return lddmc_make_copynode(mddnode_getdown(na), right);
    } else if (*copy) {
        return lddmc_make_copynode(lddmc_cube_copy(values+1, copy+1, count-1), a);
    }

    uint32_t na_value = mddnode_getvalue(na);
    if (na_value < *values) {
        MDD right = lddmc_union_cube_copy(mddnode_getright(na), values, copy, count);
        if (right == mddnode_getright(na)) return a; // no actual change
        return lddmc_makenode(na_value, mddnode_getdown(na), right);
    } else if (na_value == *values) {
        MDD down = lddmc_union_cube_copy(mddnode_getdown(na), values+1, copy+1, count-1);
        if (down == mddnode_getdown(na)) return a; // no actual change
        return lddmc_makenode(na_value, down, mddnode_getright(na));
    } else /* na_value > *values */ {
        return lddmc_makenode(*values, lddmc_cube_copy(values+1, copy+1, count-1), a);
    }
}